

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-all.c
# Opt level: O0

void do_tb_phys_invalidate
               (TCGContext_conflict9 *tcg_ctx,TranslationBlock_conflict *tb,_Bool rm_from_page_list)

{
  target_ulong_conflict pc;
  CPUState_conflict *pCVar1;
  uc_struct_conflict10 *uc_00;
  tb_page_addr_t tVar2;
  _Bool locked;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  PageDesc *pPVar7;
  _Bool code_gen_locked;
  tb_page_addr_t phys_pc;
  uint32_t h;
  PageDesc *p;
  uc_struct_conflict15 *uc;
  CPUState *cpu;
  _Bool rm_from_page_list_local;
  TranslationBlock_conflict *tb_local;
  TCGContext_conflict9 *tcg_ctx_local;
  
  pCVar1 = tcg_ctx->uc->cpu;
  uc_00 = tcg_ctx->uc;
  locked = tb_exec_is_locked(tcg_ctx);
  tb_exec_unlock_tricore(tcg_ctx);
  tb->cflags = tb->cflags | 0x40000;
  tVar2 = tb->page_addr[0];
  uVar6 = tb->pc;
  pc = tb->pc;
  uVar5 = tb->flags;
  uVar4 = tb_cflags(tb);
  uVar5 = tb_hash_func(tVar2 + (uVar6 & 0x3fff),pc,uVar5,uVar4 & 0xff0affff,tb->trace_vcpu_dstate);
  if (((tb->cflags & 0x10000) != 0) ||
     (_Var3 = qht_remove(&(tcg_ctx->tb_ctx).htable,tb,uVar5), _Var3)) {
    if (rm_from_page_list) {
      pPVar7 = page_find((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[0] >> 0xe);
      tb_page_remove(pPVar7,tb);
      invalidate_page_bitmap(pPVar7);
      if (tb->page_addr[1] != 0xffffffffffffffff) {
        pPVar7 = page_find((uc_struct_conflict15 *)tcg_ctx->uc,tb->page_addr[1] >> 0xe);
        tb_page_remove(pPVar7,tb);
        invalidate_page_bitmap(pPVar7);
      }
    }
    uVar6 = tb_jmp_cache_hash_func((uc_struct_conflict15 *)uc_00,tb->pc);
    if (pCVar1->tb_jmp_cache[uVar6] == tb) {
      pCVar1->tb_jmp_cache[uVar6] = (TranslationBlock_conflict *)0x0;
    }
    tb_remove_from_jmp_list(tb,0);
    tb_remove_from_jmp_list(tb,1);
    tb_jmp_unlink(tb);
    tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;
    tb_exec_change(tcg_ctx,locked);
  }
  else {
    tb_exec_change(tcg_ctx,locked);
  }
  return;
}

Assistant:

static void do_tb_phys_invalidate(TCGContext *tcg_ctx, TranslationBlock *tb, bool rm_from_page_list)
{
    CPUState *cpu = tcg_ctx->uc->cpu;
    struct uc_struct *uc = tcg_ctx->uc;
    PageDesc *p;
    uint32_t h;
    tb_page_addr_t phys_pc;
    bool code_gen_locked;

    assert_memory_lock();
    code_gen_locked = tb_exec_is_locked(tcg_ctx);
    tb_exec_unlock(tcg_ctx);

    /* make sure no further incoming jumps will be chained to this TB */
    tb->cflags = tb->cflags | CF_INVALID;

    /* remove the TB from the hash list */
    phys_pc = tb->page_addr[0] + (tb->pc & ~TARGET_PAGE_MASK);
    h = tb_hash_func(phys_pc, tb->pc, tb->flags, tb_cflags(tb) & CF_HASH_MASK,
                     tb->trace_vcpu_dstate);
    if (!(tb->cflags & CF_NOCACHE) &&
        !qht_remove(&tcg_ctx->tb_ctx.htable, tb, h)) {
        tb_exec_change(tcg_ctx, code_gen_locked);
        return;
    }

    /* remove the TB from the page list */
    if (rm_from_page_list) {
        p = page_find(tcg_ctx->uc, tb->page_addr[0] >> TARGET_PAGE_BITS);
        tb_page_remove(p, tb);
        invalidate_page_bitmap(p);
        if (tb->page_addr[1] != -1) {
            p = page_find(tcg_ctx->uc, tb->page_addr[1] >> TARGET_PAGE_BITS);
            tb_page_remove(p, tb);
            invalidate_page_bitmap(p);
        }
    }

    /* remove the TB from the hash list */
    h = tb_jmp_cache_hash_func(uc, tb->pc);
    if (cpu->tb_jmp_cache[h] == tb) {
        cpu->tb_jmp_cache[h] = NULL;
    }

    /* suppress this TB from the two jump lists */
    tb_remove_from_jmp_list(tb, 0);
    tb_remove_from_jmp_list(tb, 1);

    /* suppress any remaining jumps to this TB */
    tb_jmp_unlink(tb);

    tcg_ctx->tb_phys_invalidate_count = tcg_ctx->tb_phys_invalidate_count + 1;

    tb_exec_change(tcg_ctx, code_gen_locked);
}